

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::select_base::add(select_base *this,string *str)

{
  string id;
  string local_108;
  element local_e8;
  
  impl::todec_string<unsigned_long>
            (&local_108,
             ((long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5);
  element::element(&local_e8,&local_108,str);
  std::
  vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
  ::emplace_back<cppcms::widgets::select_base::element>(&this->elements_,&local_e8);
  element::~element(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void select_base::add(std::string const &str)
{
	std::string id= impl::todec_string(elements_.size());
	elements_.push_back(element(id,str));
}